

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

void __thiscall wabt::TypeChecker::PushType(TypeChecker *this,Type type)

{
  value_type local_4;
  
  if (type.enum_ != Void) {
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back(&this->type_stack_,&local_4);
  }
  return;
}

Assistant:

void TypeChecker::PushType(Type type) {
  if (type != Type::Void) {
    type_stack_.push_back(type);
  }
}